

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  upb_MiniTable *puVar4;
  upb_Map *map;
  upb_Array *arr;
  undefined8 *puVar5;
  long lVar6;
  char *pcVar7;
  _Bool _Var8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  uint32_t tag;
  size_t __n;
  upb_MiniTable *puVar12;
  uint uVar13;
  ulong uVar14;
  char *val_00;
  long lVar15;
  uint *******pppppppuVar16;
  ulong uVar17;
  bool bVar18;
  intptr_t iter_1;
  upb_StringView strkey;
  upb_value val;
  intptr_t iter;
  upb_MapEntry ent;
  uint *******local_90;
  upb_StringView local_88;
  upb_value local_78;
  _upb_mapsorter *local_70;
  uintptr_t local_68;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_60 [2];
  anon_union_16_3_fdccde34_for_k local_50;
  anon_union_16_3_fdccde34_for_v local_40;
  
  bVar2 = field->mode_dont_copy_me__upb_internal_use_only;
  switch(bVar2 & 3) {
  case 0:
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    if (puVar4->field_count_dont_copy_me__upb_internal_use_only != 2) {
      __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                    ,0x1bc,
                    "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    map = *(upb_Map **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (map == (upb_Map *)0x0) {
      return;
    }
    sVar11 = upb_Map_Size(map);
    if (sVar11 == 0) {
      return;
    }
    if ((e->options & 1) == 0) {
      if (map->is_strtable_dont_copy_me__upb_internal_use_only != true) {
        local_90 = (uint *******)0xffffffffffffffff;
        local_68 = 0;
        _Var8 = upb_inttable_next(&(map->t).inttable,&local_68,&local_78,(intptr_t *)&local_90);
        if (!_Var8) {
          return;
        }
        do {
          memcpy(&local_50,&local_68,(long)map->key_size);
          local_88.data = (char *)local_78.val;
          if ((long)map->val_size == 0) {
            local_40.str.data = (char *)*(undefined8 *)local_78.val;
            local_40.str.size = (size_t)*(uint *******)(local_78.val + 8);
          }
          else {
            memcpy(&local_40,&local_88,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                          (upb_MapEntry *)local_60);
          _Var8 = upb_inttable_next(&(map->t).inttable,&local_68,&local_78,(intptr_t *)&local_90);
        } while (_Var8);
        return;
      }
      local_68 = 0xffffffffffffffff;
      _Var8 = upb_strtable_next2(&(map->t).strtable,&local_88,&local_78,(intptr_t *)&local_68);
      if (!_Var8) {
        return;
      }
      do {
        if ((long)map->key_size == 0) {
          local_50.val.val = (upb_value)(upb_value)local_88.data;
        }
        else {
          memcpy(&local_50,local_88.data,(long)map->key_size);
        }
        local_90 = (uint *******)local_78.val;
        if ((long)map->val_size == 0) {
          local_40.str.data = (char *)*(undefined8 *)local_78.val;
          local_40.str.size = (size_t)*(uint *******)(local_78.val + 8);
        }
        else {
          memcpy(&local_40,&local_90,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                        (upb_MapEntry *)local_60);
        _Var8 = upb_strtable_next2(&(map->t).strtable,&local_88,&local_78,(intptr_t *)&local_68);
      } while (_Var8);
      return;
    }
    if ((map->is_strtable_dont_copy_me__upb_internal_use_only == false) &&
       ((map->t).inttable.array_size != 0)) {
      pppppppuVar16 = (uint *******)0x0;
      do {
        if (((map->t).inttable.presence_mask[(ulong)pppppppuVar16 >> 3] >> ((uint)pppppppuVar16 & 7)
            & 1) != 0) {
          local_88.data = (char *)(map->t).inttable.array[(long)pppppppuVar16].val;
          local_50._0_8_ = pppppppuVar16;
          if ((long)map->val_size == 0) {
            local_40.str.data = (char *)*(undefined8 *)local_88.data;
            local_40.str.size = (size_t)*(uint *******)((long)local_88.data + 8);
          }
          else {
            memcpy(&local_40,&local_88,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                          (upb_MapEntry *)local_60);
        }
        pppppppuVar16 = (uint *******)((long)pppppppuVar16 + 1);
      } while (pppppppuVar16 < (uint *******)(ulong)(map->t).inttable.array_size);
    }
    local_70 = &e->sorter;
    _upb_mapsorter_pushmap
              (local_70,(uint)puVar4->fields_dont_copy_me__upb_internal_use_only->
                              descriptortype_dont_copy_me__upb_internal_use_only,map,
               (_upb_sortedmap *)&local_88);
    bVar18 = local_88.data._4_4_ == (int)local_88.size;
    iVar9 = local_88.data._4_4_;
    while (!bVar18) {
      local_88.data = (char *)CONCAT44(iVar9 + 1,(int)local_88.data);
      puVar5 = (undefined8 *)local_70->entries[iVar9];
      if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
        pppppppuVar16 = (uint *******)((uint *)puVar5[1] + 1);
        __n = (size_t)map->key_size;
        if (__n != 0) goto LAB_0029004c;
        local_50.str.size = (size_t)*(uint *)puVar5[1];
        local_50.str.data = (char *)pppppppuVar16;
      }
      else {
        local_90 = (uint *******)puVar5[1];
        __n = (size_t)map->key_size;
        pppppppuVar16 = (uint *******)&local_90;
LAB_0029004c:
        memcpy(&local_50,pppppppuVar16,__n);
      }
      local_90 = (uint *******)*puVar5;
      if ((long)map->val_size == 0) {
        local_40.str.data = (char *)*local_90;
        local_40.str.size = (size_t)local_90[1];
      }
      else {
        memcpy(&local_40,&local_90,(long)map->val_size);
      }
      if (bVar18) break;
      encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                      (upb_MapEntry *)local_60);
      iVar9 = local_88.data._4_4_;
      bVar18 = local_88.data._4_4_ == (int)local_88.size;
    }
    (e->sorter).size = (int)local_88.data;
    return;
  case 1:
    arr = *(upb_Array **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (arr == (upb_Array *)0x0) {
      return;
    }
    sVar11 = arr->size_dont_copy_me__upb_internal_use_only;
    if (sVar11 == 0) {
      return;
    }
    break;
  case 2:
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (ulong)field->offset_dont_copy_me__upb_internal_use_only),subs,field);
    return;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                  ,0x224,
                  "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  local_70 = (_upb_mapsorter *)((long)e->ptr - (long)e->limit);
  switch(field->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 1;
    }
    sVar11 = 8;
    goto LAB_00290186;
  case '\x02':
  case '\a':
  case '\x0f':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 5;
    }
    sVar11 = 4;
LAB_00290186:
    encode_fixedarray(e,arr,sVar11,tag);
    break;
  case '\x03':
  case '\x04':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 3;
    do {
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      if ((uVar14 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
    break;
  case '\x05':
  case '\x0e':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      iVar9 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      if (((ulong)(long)iVar9 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)iVar9;
      }
      else {
        encode_longvarint(e,(long)iVar9);
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\b':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    do {
      bVar3 = *(byte *)(((uVar17 & 0xfffffffffffffff8) - 1) + sVar11);
      pcVar7 = e->ptr;
      if (pcVar7 == e->buf) {
        encode_longvarint(e,(ulong)bVar3);
      }
      else {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = bVar3;
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    break;
  case '\t':
  case '\f':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8;
    lVar15 = sVar11 << 4;
    do {
      encode_bytes(e,*(void **)((uVar17 - 0x10) + lVar15),*(size_t *)((uVar17 - 8) + lVar15));
      uVar14 = *(ulong *)((uVar17 - 8) + lVar15);
      if ((uVar14 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      uVar10 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar10;
      }
      else {
        encode_longvarint(e,(ulong)uVar10);
      }
      lVar15 = lVar15 + -0x10;
    } while (lVar15 != 0);
    return;
  case '\n':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_00290841:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    lVar15 = sVar11 << 3;
    do {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only * 8 + 4;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar10;
      }
      else {
        encode_longvarint(e,(ulong)uVar10);
      }
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      puVar12 = puVar4;
      if ((uVar14 & 1) != 0) {
        puVar12 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar14 & 0xfffffffffffffffe),puVar12,
                     &local_60[0].internal_opaque);
      uVar10 = field->number_dont_copy_me__upb_internal_use_only * 8 + 3;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar10;
      }
      else {
        encode_longvarint(e,(ulong)uVar10);
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
    goto LAB_002906d3;
  case '\v':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_00290841;
    lVar15 = sVar11 << 3;
    do {
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      puVar12 = puVar4;
      if ((uVar14 & 1) != 0) {
        puVar12 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar14 & 0xfffffffffffffffe),puVar12,
                     &local_60[0].internal_opaque);
      if (((ulong)local_60[0] < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)local_60[0].internal_opaque;
      }
      else {
        encode_longvarint(e,local_60[0].internal_opaque);
      }
      uVar10 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar10;
      }
      else {
        encode_longvarint(e,(ulong)uVar10);
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
LAB_002906d3:
    e->depth = e->depth + 1;
    return;
  case '\r':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      uVar13 = *(uint *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      if (((ulong)uVar13 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,(ulong)uVar13);
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\x11':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      iVar9 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      uVar13 = iVar9 >> 0x1f ^ iVar9 * 2;
      if ((uVar13 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,(ulong)uVar13);
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\x12':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar10 = 0;
    if ((bVar2 & 4) == 0) {
      uVar10 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 3;
    do {
      lVar6 = *(long *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      uVar14 = lVar6 >> 0x3f ^ lVar6 * 2;
      if ((uVar14 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
        e->ptr = pcVar7 + -1;
        pcVar7[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      if ((ulong)uVar10 != 0) {
        if ((uVar10 < 0x80) && (pcVar7 = e->ptr, pcVar7 != e->buf)) {
          e->ptr = pcVar7 + -1;
          pcVar7[-1] = (char)uVar10;
        }
        else {
          encode_longvarint(e,(ulong)uVar10);
        }
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
  }
  if ((bVar2 & 4) != 0) {
    pcVar7 = e->ptr;
    val_00 = e->limit + ((long)local_70 - (long)pcVar7);
    if ((val_00 < (char *)0x80) && (pcVar7 != e->buf)) {
      e->ptr = pcVar7 + -1;
      pcVar7[-1] = (char)val_00;
    }
    else {
      encode_longvarint(e,(uint64_t)val_00);
    }
    uVar10 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
    if ((0x7f < field->number_dont_copy_me__upb_internal_use_only << 3) ||
       (pcVar7 = e->ptr, pcVar7 == e->buf)) {
      encode_longvarint(e,(ulong)uVar10);
      return;
    }
    e->ptr = pcVar7 + -1;
    pcVar7[-1] = (char)uVar10;
  }
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}